

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::JapaneseCalendar::getDefaultDayInMonth(JapaneseCalendar *this,int32_t eyear,int32_t month)

{
  int eraIdx;
  int32_t iVar1;
  int32_t eraStart [3];
  UErrorCode status;
  
  eraIdx = (*(this->super_GregorianCalendar).super_Calendar.super_UObject._vptr_UObject[0x32])();
  eraStart[2] = 0;
  eraStart[0] = 0;
  eraStart[1] = 0;
  status = U_ZERO_ERROR;
  EraRules::getStartDate(gJapaneseEraRules,eraIdx,&eraStart,&status);
  iVar1 = 1;
  if ((eraStart[0] == eyear) && (eraStart[1] + -1 == month)) {
    iVar1 = eraStart[2];
  }
  return iVar1;
}

Assistant:

int32_t JapaneseCalendar::getDefaultDayInMonth(int32_t eyear, int32_t month) 
{
    int32_t era = internalGetEra();
    int32_t day = 1;

    int32_t eraStart[3] = { 0,0,0 };
    UErrorCode status = U_ZERO_ERROR;
    gJapaneseEraRules->getStartDate(era, eraStart, status);
    U_ASSERT(U_SUCCESS(status));
    if(eyear == eraStart[0]) {
        if(month == eraStart[1] - 1) {
            return eraStart[2];
        }
    }

    return day;
}